

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QDockAreaLayoutInfo::plug(QDockAreaLayoutInfo *this,QList<int> *path)

{
  ulong uVar1;
  QDockAreaLayoutInfo *this_00;
  pointer pQVar2;
  QLayoutItem *pQVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<int> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (path->d).size;
  uVar4 = *(path->d).ptr;
  uVar4 = (int)uVar4 >> 0x1f ^ uVar4;
  pQVar2 = QList<QDockAreaLayoutItem>::data(&this->item_list);
  if (uVar1 < 2) {
    *(byte *)&pQVar2[uVar4].flags = (byte)pQVar2[uVar4].flags & 0xfe;
    pQVar3 = pQVar2[uVar4].widgetItem;
  }
  else {
    this_00 = pQVar2[uVar4].subinfo;
    QList<int>::mid((QList<int> *)&QStack_38,path,1,-1);
    pQVar3 = plug(this_00,(QList<int> *)&QStack_38);
    QArrayDataPointer<int>::~QArrayDataPointer(&QStack_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QDockAreaLayoutInfo::plug(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());

    int index = path.first();
    if (index < 0)
        index = -index - 1;

    if (path.size() > 1) {
        QDockAreaLayoutItem &item = item_list[index];
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->plug(path.mid(1));
    }

    QDockAreaLayoutItem &item = item_list[index];

    Q_ASSERT(item.widgetItem != nullptr);
    Q_ASSERT(item.flags & QDockAreaLayoutItem::GapItem);
    item.flags &= ~QDockAreaLayoutItem::GapItem;
    return item.widgetItem;
}